

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APFloat.cpp
# Opt level: O1

opStatus __thiscall
llvm::detail::IEEEFloat::normalize
          (IEEEFloat *this,roundingMode rounding_mode,lostFraction lost_fraction)

{
  fltSemantics *pfVar1;
  uint uVar2;
  opStatus oVar3;
  lostFraction lVar4;
  uint uVar5;
  int iVar6;
  Significand *parts;
  uint bits;
  Significand *parts_00;
  bool bVar7;
  
  oVar3 = opOK;
  if ((this->field_0x12 & 7) != 3 && (this->field_0x12 & 6) != 0) {
    uVar5 = this->semantics->precision;
    parts_00 = &this->significand;
    parts = parts_00;
    if (uVar5 - 0x40 < 0xffffff80) {
      parts = (Significand *)(this->significand).parts;
    }
    uVar2 = APInt::tcMSB(&parts->part,uVar5 + 0x40 >> 6);
    uVar2 = uVar2 + 1;
    uVar5 = 0;
    if (uVar2 != 0) {
      pfVar1 = this->semantics;
      bits = uVar2 - pfVar1->precision;
      iVar6 = (int)this->exponent + bits;
      if (pfVar1->maxExponent < iVar6) {
        oVar3 = handleOverflow(this,rounding_mode);
        return oVar3;
      }
      if (iVar6 < pfVar1->minExponent) {
        bits = (int)pfVar1->minExponent - (int)this->exponent;
      }
      if ((int)bits < 0) {
        if (lost_fraction == lfExactlyZero) {
          shiftSignificandLeft(this,-bits);
          return opOK;
        }
        __assert_fail("lost_fraction == lfExactlyZero",
                      "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                      ,0x516,
                      "IEEEFloat::opStatus llvm::detail::IEEEFloat::normalize(roundingMode, lostFraction)"
                     );
      }
      uVar5 = uVar2;
      if (bits != 0) {
        lVar4 = shiftSignificandRight(this,bits);
        bVar7 = lost_fraction != lfExactlyZero;
        lost_fraction = lVar4;
        if (bVar7) {
          if (lVar4 == lfExactlyZero) {
            lost_fraction = lfLessThanHalf;
          }
          else {
            lost_fraction = lfMoreThanHalf;
            if (lVar4 != lfExactlyHalf) {
              lost_fraction = lVar4;
            }
          }
        }
        uVar5 = uVar2 - bits;
        if (uVar2 < bits) {
          uVar5 = 0;
        }
      }
    }
    if (lost_fraction == lfExactlyZero) {
      oVar3 = opOK;
    }
    else {
      bVar7 = roundAwayFromZero(this,rounding_mode,lost_fraction,0);
      if (bVar7) {
        if (uVar5 == 0) {
          this->exponent = this->semantics->minExponent;
        }
        incrementSignificand(this);
        uVar5 = this->semantics->precision;
        if (uVar5 - 0x40 < 0xffffff80) {
          parts_00 = (Significand *)(this->significand).parts;
        }
        uVar5 = APInt::tcMSB(&parts_00->part,uVar5 + 0x40 >> 6);
        if (uVar5 == this->semantics->precision) {
          if (this->exponent == this->semantics->maxExponent) {
            this->field_0x12 = this->field_0x12 & 0xf8;
            return opInexact|opOverflow;
          }
          shiftSignificandRight(this,1);
          return opInexact;
        }
        uVar5 = uVar5 + 1;
      }
      uVar2 = this->semantics->precision;
      if (uVar5 == uVar2) {
        return opInexact;
      }
      if (uVar2 <= uVar5) {
        __assert_fail("omsb < semantics->precision",
                      "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                      ,0x559,
                      "IEEEFloat::opStatus llvm::detail::IEEEFloat::normalize(roundingMode, lostFraction)"
                     );
      }
      oVar3 = opInexact|opUnderflow;
    }
    if (uVar5 == 0) {
      this->field_0x12 = this->field_0x12 & 0xf8 | 3;
    }
  }
  return oVar3;
}

Assistant:

IEEEFloat::opStatus IEEEFloat::normalize(roundingMode rounding_mode,
                                         lostFraction lost_fraction) {
  unsigned int omsb;                /* One, not zero, based MSB.  */
  int exponentChange;

  if (!isFiniteNonZero())
    return opOK;

  /* Before rounding normalize the exponent of fcNormal numbers.  */
  omsb = significandMSB() + 1;

  if (omsb) {
    /* OMSB is numbered from 1.  We want to place it in the integer
       bit numbered PRECISION if possible, with a compensating change in
       the exponent.  */
    exponentChange = omsb - semantics->precision;

    /* If the resulting exponent is too high, overflow according to
       the rounding mode.  */
    if (exponent + exponentChange > semantics->maxExponent)
      return handleOverflow(rounding_mode);

    /* Subnormal numbers have exponent minExponent, and their MSB
       is forced based on that.  */
    if (exponent + exponentChange < semantics->minExponent)
      exponentChange = semantics->minExponent - exponent;

    /* Shifting left is easy as we don't lose precision.  */
    if (exponentChange < 0) {
      assert(lost_fraction == lfExactlyZero);

      shiftSignificandLeft(-exponentChange);

      return opOK;
    }

    if (exponentChange > 0) {
      lostFraction lf;

      /* Shift right and capture any new lost fraction.  */
      lf = shiftSignificandRight(exponentChange);

      lost_fraction = combineLostFractions(lf, lost_fraction);

      /* Keep OMSB up-to-date.  */
      if (omsb > (unsigned) exponentChange)
        omsb -= exponentChange;
      else
        omsb = 0;
    }
  }

  /* Now round the number according to rounding_mode given the lost
     fraction.  */

  /* As specified in IEEE 754, since we do not trap we do not report
     underflow for exact results.  */
  if (lost_fraction == lfExactlyZero) {
    /* Canonicalize zeroes.  */
    if (omsb == 0)
      category = fcZero;

    return opOK;
  }

  /* Increment the significand if we're rounding away from zero.  */
  if (roundAwayFromZero(rounding_mode, lost_fraction, 0)) {
    if (omsb == 0)
      exponent = semantics->minExponent;

    incrementSignificand();
    omsb = significandMSB() + 1;

    /* Did the significand increment overflow?  */
    if (omsb == (unsigned) semantics->precision + 1) {
      /* Renormalize by incrementing the exponent and shifting our
         significand right one.  However if we already have the
         maximum exponent we overflow to infinity.  */
      if (exponent == semantics->maxExponent) {
        category = fcInfinity;

        return (opStatus) (opOverflow | opInexact);
      }

      shiftSignificandRight(1);

      return opInexact;
    }
  }

  /* The normal case - we were and are not denormal, and any
     significand increment above didn't overflow.  */
  if (omsb == semantics->precision)
    return opInexact;

  /* We have a non-zero denormal.  */
  assert(omsb < semantics->precision);

  /* Canonicalize zeroes.  */
  if (omsb == 0)
    category = fcZero;

  /* The fcZero case is a denormal that underflowed to zero.  */
  return (opStatus) (opUnderflow | opInexact);
}